

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphOptimizations.cpp
# Opt level: O0

void __thiscall
dg::pta::PSEquivalentNodesMerger::merge(PSEquivalentNodesMerger *this,PSNode *node1,PSNode *node2)

{
  PSNode *in_RSI;
  PSNode *in_RDI;
  PointsToMapping<dg::pta::PSNode_*> *unaff_retaddr;
  PSNode *in_stack_ffffffffffffffd8;
  PSNode *val;
  
  val = in_RDI;
  SubgraphNode<dg::pta::PSNode>::replaceAllUsesWith
            ((SubgraphNode<dg::pta::PSNode> *)this,node1,node2._7_1_);
  removeNode((PointerGraph *)in_RDI,in_stack_ffffffffffffffd8);
  PointsToMapping<dg::pta::PSNode_*>::add(unaff_retaddr,val,in_RSI);
  *(int *)&(in_RDI->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
           super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
           super__Vector_impl_data._M_start =
       *(int *)&(in_RDI->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
                super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
  return;
}

Assistant:

void PSEquivalentNodesMerger::merge(PSNode *node1, PSNode *node2) {
    // remove node1
    node1->replaceAllUsesWith(node2);
    removeNode(G, node1);

    // update the mapping
    mapping.add(node1, node2);

    ++merged_nodes_num;
}